

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O1

MemberSyntax * __thiscall slang::parsing::Parser::parseGenerateBlock(Parser *this)

{
  SyntaxNode *pSVar1;
  NamedLabelSyntax *label;
  NamedBlockClauseSyntax *beginName;
  bool bVar2;
  int iVar3;
  Diagnostic *this_00;
  SourceLocation SVar4;
  undefined4 extraout_var;
  NamedBlockClauseSyntax *endBlock;
  GenerateBlockSyntax *pGVar5;
  byte bVar6;
  byte bVar7;
  Token TVar8;
  SourceRange range;
  string_view arg;
  Token colon;
  Token begin;
  bool anyLocalModules;
  MemberSyntax *member;
  Token end;
  SmallVector<slang::syntax::MemberSyntax_*,_8UL> members;
  bool local_109;
  NamedLabelSyntax *local_108;
  MemberSyntax *local_100;
  Token *local_f8;
  Token *local_f0;
  NamedBlockClauseSyntax *local_e8;
  Info *local_e0;
  undefined8 local_d8;
  Token local_d0;
  TokenList local_c0;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_88;
  
  bVar2 = ParserBase::peek(&this->super_ParserBase,BeginKeyword);
  if (bVar2) {
    local_108 = (NamedLabelSyntax *)0x0;
LAB_001ecc8d:
    TVar8 = ParserBase::consume(&this->super_ParserBase);
    local_e0 = TVar8.info;
    local_d8 = TVar8._0_8_;
    local_e8 = parseNamedBlockClause(this);
    Token::Token(&local_d0);
    local_88.super_SyntaxListBase.super_SyntaxNode._0_8_ = 0;
    local_88.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)((long)&local_88 + 0x18);
    local_88.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x8;
    local_109 = false;
    local_f0 = &(this->super_ParserBase).lastPoppedDelims.first;
    local_f8 = &(this->super_ParserBase).lastPoppedDelims.second;
    bVar6 = 0;
    do {
      TVar8 = ParserBase::peek(&this->super_ParserBase);
      bVar2 = false;
      if ((TVar8.kind != EndOfFile) && ((TVar8._0_4_ & 0xffff) != 0x8e)) {
        local_100 = parseMember(this,GenerateBlock,&local_109);
        if (local_100 == (MemberSyntax *)0x0) {
          bVar2 = slang::syntax::SyntaxFacts::isCloseDelimOrKeyword(TVar8.kind);
          if (bVar2) {
            local_c0.super_SyntaxListBase._0_16_ = ParserBase::peek(&this->super_ParserBase);
            range = Token::range((Token *)&local_c0);
            this_00 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0xb80005,range);
            local_c0.super_SyntaxListBase._0_16_ = ParserBase::peek(&this->super_ParserBase);
            arg = Token::valueText((Token *)&local_c0);
            Diagnostic::operator<<(this_00,arg);
            bVar6 = 1;
            if (((this->super_ParserBase).lastPoppedDelims.first.info != (Info *)0x0) &&
               ((this->super_ParserBase).lastPoppedDelims.second.info != (Info *)0x0)) {
              SVar4 = Token::location(local_f0);
              Diagnostic::addNote(this_00,(DiagCode)0xc10005,SVar4);
              SVar4 = Token::location(local_f8);
              Diagnostic::addNote(this_00,(DiagCode)0xc00005,SVar4);
            }
          }
          bVar7 = ~bVar6;
          bVar6 = 1;
          ParserBase::skipToken
                    (&this->super_ParserBase,
                     (optional<slang::DiagCode>)((uint6)(bVar7 & 1) << 0x20 | 0x450005));
        }
        else {
          checkMemberAllowed(this,&local_100->super_SyntaxNode,GenerateBlock);
          SmallVectorBase<slang::syntax::MemberSyntax*>::
          emplace_back<slang::syntax::MemberSyntax*const&>
                    ((SmallVectorBase<slang::syntax::MemberSyntax*> *)&local_88,&local_100);
          pSVar1 = this->previewNode;
          this->previewNode = (SyntaxNode *)0x0;
          (local_100->super_SyntaxNode).previewNode = pSVar1;
          bVar6 = 0;
        }
        bVar2 = true;
      }
    } while (bVar2);
    if (local_109 == true) {
      SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
      ::pop_back(&(this->moduleDeclStack).
                  super_SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                );
    }
    local_d0 = ParserBase::expect(&this->super_ParserBase,EndKeyword);
    iVar3 = SmallVectorBase<slang::syntax::MemberSyntax_*>::copy
                      ((SmallVectorBase<slang::syntax::MemberSyntax_*> *)&local_88,
                       (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)local_d0.info)
    ;
    if ((pointer)local_88.super_SyntaxListBase._vptr_SyntaxListBase !=
        (pointer)((long)&local_88 + 0x18U)) {
      operator_delete(local_88.super_SyntaxListBase._vptr_SyntaxListBase);
    }
    endBlock = parseNamedBlockClause(this);
    beginName = local_e8;
    label = local_108;
    checkBlockNames(this,local_e8,endBlock,local_108);
    local_88.super_SyntaxListBase.super_SyntaxNode.kind = 1;
    local_88.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
    local_88.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
    local_88.super_SyntaxListBase.childCount = 0;
    local_88.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
         (pointer)0x0;
    local_88.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
    _M_extent_value = 0;
    local_88.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_0062f0b8;
    local_c0.super_SyntaxListBase.super_SyntaxNode.kind = 1;
    local_c0.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
    local_c0.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
    local_c0.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_0062f728;
    begin.info = local_e0;
    begin.kind = (undefined2)local_d8;
    begin._2_1_ = local_d8._2_1_;
    begin.numFlags.raw = local_d8._3_1_;
    begin.rawLen = local_d8._4_4_;
    local_c0.super_span<slang::parsing::Token,_18446744073709551615UL>._M_ptr =
         (pointer)CONCAT44(extraout_var,iVar3);
    pGVar5 = slang::syntax::SyntaxFactory::generateBlock
                       (&this->factory,&local_88,label,begin,beginName,
                        (SyntaxList<slang::syntax::MemberSyntax> *)&local_c0,local_d0,endBlock);
  }
  else {
    bVar2 = ParserBase::peek(&this->super_ParserBase,Identifier);
    if (bVar2) {
      TVar8 = ParserBase::peek(&this->super_ParserBase,1);
      if (TVar8.kind == Colon) {
        TVar8 = ParserBase::peek(&this->super_ParserBase,2);
        if (TVar8.kind == BeginKeyword) {
          TVar8 = ParserBase::consume(&this->super_ParserBase);
          colon = ParserBase::consume(&this->super_ParserBase);
          local_108 = slang::syntax::SyntaxFactory::namedLabel(&this->factory,TVar8,colon);
          goto LAB_001ecc8d;
        }
      }
    }
    pGVar5 = (GenerateBlockSyntax *)parseSingleMember(this,GenerateBlock);
    if (pGVar5 == (GenerateBlockSyntax *)0x0) {
      local_88.super_SyntaxListBase._0_16_ = ParserBase::peek(&this->super_ParserBase);
      SVar4 = Token::location((Token *)&local_88);
      bVar2 = ParserBase::haveDiagAtCurrentLoc(&this->super_ParserBase);
      if (!bVar2) {
        ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x450005,SVar4);
      }
      local_88.super_SyntaxListBase.super_SyntaxNode.kind = 1;
      local_88.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
      local_88.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
      local_88.super_SyntaxListBase.childCount = 0;
      local_88.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
           (pointer)0x0;
      local_88.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
      _M_extent._M_extent_value = 0;
      local_88.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_0062f0b8;
      local_c0.super_SyntaxListBase.super_SyntaxNode.kind = 2;
      local_c0.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
      local_c0.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
      local_c0.super_SyntaxListBase.childCount = 0;
      local_c0.super_span<slang::parsing::Token,_18446744073709551615UL>._M_ptr = (pointer)0x0;
      local_c0.super_span<slang::parsing::Token,_18446744073709551615UL>._M_extent._M_extent_value =
           0;
      local_c0.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_0062ed20;
      TVar8 = ParserBase::missingToken(&this->super_ParserBase,Semicolon,SVar4);
      pGVar5 = (GenerateBlockSyntax *)
               slang::syntax::SyntaxFactory::emptyMember(&this->factory,&local_88,&local_c0,TVar8);
    }
  }
  return &pGVar5->super_MemberSyntax;
}

Assistant:

MemberSyntax& Parser::parseGenerateBlock() {
    NamedLabelSyntax* label = nullptr;
    if (!peek(TokenKind::BeginKeyword)) {
        if (!peek(TokenKind::Identifier) || peek(1).kind != TokenKind::Colon ||
            peek(2).kind != TokenKind::BeginKeyword) {
            // This is just a single member instead of a block.
            auto member = parseSingleMember(SyntaxKind::GenerateBlock);
            if (member)
                return *member;

            // If there was some syntax error that caused parseMember to return null, fabricate an
            // empty member here and let our caller sort it out.
            auto loc = peek().location();
            if (!haveDiagAtCurrentLoc())
                addDiag(diag::ExpectedMember, loc);
            return factory.emptyMember(nullptr, nullptr, missingToken(TokenKind::Semicolon, loc));
        }

        auto name = consume();
        label = &factory.namedLabel(name, consume());
    }

    auto begin = consume();
    auto beginName = parseNamedBlockClause();

    Token end;
    auto members =
        parseMemberList<MemberSyntax>(TokenKind::EndKeyword, end, SyntaxKind::GenerateBlock,
                                      [this](SyntaxKind parentKind, bool& anyLocalModules) {
                                          return parseMember(parentKind, anyLocalModules);
                                      });

    auto endName = parseNamedBlockClause();
    checkBlockNames(beginName, endName, label);

    return factory.generateBlock(nullptr, // never any attributes
                                 label, begin, beginName, members, end, endName);
}